

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov1detection.cpp
# Opt level: O0

int __thiscall
ncnn::Yolov1Detection::forward_inplace(Yolov1Detection *this,Mat *bottom_top_blob,Option *opt)

{
  bool bVar1;
  Mat *this_00;
  size_type sVar2;
  reference pvVar3;
  float *pfVar4;
  undefined8 in_RDX;
  Mat *in_RSI;
  Allocator *in_RDI;
  float *outptr;
  ObjectBox *r;
  size_t i_1;
  vector<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_> detected_objects;
  ObjectBox object;
  float prob;
  int j;
  float scale;
  float ymax;
  float xmax;
  float ymin;
  float xmin;
  float h;
  float w;
  int n;
  int y_offset;
  int x_offset;
  int i;
  float *boxes_ptr;
  float *scales_ptr;
  float *classes_ptr;
  ObjectsManager objects;
  Mat classes_scores;
  int map_total;
  int size;
  Mat *in_stack_fffffffffffffe40;
  size_type sVar5;
  undefined7 in_stack_fffffffffffffe48;
  undefined1 in_stack_fffffffffffffe4f;
  ObjectsManager *in_stack_fffffffffffffe50;
  Mat *this_01;
  vector<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_> *pvVar6;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  ObjectsManager *in_stack_fffffffffffffe70;
  ObjectsManager *in_stack_fffffffffffffe80;
  Mat *in_stack_fffffffffffffe88;
  size_type local_170;
  vector<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_> local_160;
  float local_144;
  float local_140;
  float local_13c;
  float local_138;
  float local_134;
  int local_130;
  float local_12c;
  int local_128;
  float local_124;
  float local_120;
  float local_11c;
  float local_118;
  float local_114;
  float local_110;
  float local_10c;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  float *local_f8;
  float *local_f0;
  Mat *local_e8;
  ObjectsManager local_68;
  int local_28;
  int local_24;
  undefined8 local_20;
  Mat *local_18;
  int local_4;
  
  local_24 = *(int *)(in_RDI + 0xb8) * *(int *)(in_RDI + 0xb8);
  local_28 = local_24 * (*(int *)(in_RDI + 0xc0) * 5 + *(int *)(in_RDI + 0xbc));
  if (in_RSI->w < local_28) {
    local_4 = -1;
  }
  else {
    local_18 = in_RSI;
    if (*(int *)(in_RDI + 200) != 0) {
      in_stack_fffffffffffffe70 = &local_68;
      in_stack_fffffffffffffe6c = 0;
      local_20 = in_RDX;
      Mat::range((Mat *)CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48),
                 (int)((ulong)in_stack_fffffffffffffe40 >> 0x20),(int)in_stack_fffffffffffffe40);
      Mat::reshape(in_stack_fffffffffffffe88,(int)((ulong)in_stack_fffffffffffffe80 >> 0x20),
                   (int)in_stack_fffffffffffffe80,in_RDI);
      Mat::~Mat((Mat *)0x1b5c73);
      (**(code **)(**(long **)(in_RDI + 0xd8) + 0x48))(*(long **)(in_RDI + 0xd8),&local_68,local_20)
      ;
      Mat::~Mat((Mat *)0x1b5ca7);
    }
    ObjectsManager::ObjectsManager
              (in_stack_fffffffffffffe70,
               CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    this_00 = (Mat *)Mat::operator_cast_to_float_(local_18);
    local_f0 = (float *)((long)&this_00->data + (long)(local_24 * *(int *)(in_RDI + 0xbc)) * 4);
    local_f8 = local_f0 + local_24 * *(int *)(in_RDI + 0xc0);
    local_e8 = this_00;
    for (local_fc = 0; local_fc < local_24; local_fc = local_fc + 1) {
      local_100 = local_fc % *(int *)(in_RDI + 0xb8);
      local_104 = local_fc / *(int *)(in_RDI + 0xb8);
      for (local_108 = 0; local_108 < *(int *)(in_RDI + 0xc0); local_108 = local_108 + 1) {
        local_10c = (float)(*(int *)(in_RDI + 0xc4) == 0) * local_f8[2] +
                    (float)(*(int *)(in_RDI + 0xc4) != 0) * local_f8[2] * local_f8[2];
        local_110 = (float)(*(int *)(in_RDI + 0xc4) == 0) * local_f8[3] +
                    (float)(*(int *)(in_RDI + 0xc4) != 0) * local_f8[3] * local_f8[3];
        local_114 = (*local_f8 + (float)local_100) / (float)*(int *)(in_RDI + 0xb8) -
                    local_10c * 0.5;
        local_118 = (local_f8[1] + (float)local_104) / (float)*(int *)(in_RDI + 0xb8) -
                    local_110 * 0.5;
        local_11c = local_114 + local_10c;
        local_120 = local_118 + local_110;
        local_f8 = local_f8 + 4;
        local_124 = *local_f0;
        local_f0 = local_f0 + 1;
        for (local_128 = 0; local_128 < *(int *)(in_RDI + 0xbc); local_128 = local_128 + 1) {
          local_12c = local_124 * *(float *)((long)&local_e8->data + (long)local_128 * 4);
          if (*(float *)(in_RDI + 0xcc) <= local_12c && local_12c != *(float *)(in_RDI + 0xcc)) {
            local_144 = local_114;
            local_140 = local_118;
            local_13c = local_11c;
            local_138 = local_120;
            local_130 = local_128;
            local_134 = local_12c;
            ObjectsManager::add_new_object_box
                      (in_stack_fffffffffffffe50,
                       (ObjectBox *)CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48));
          }
        }
      }
      local_e8 = (Mat *)((long)&local_e8->data + (long)*(int *)(in_RDI + 0xbc) * 4);
    }
    pvVar6 = &local_160;
    std::vector<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>::vector
              ((vector<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_> *)0x1b6121);
    ObjectsManager::do_objects_nms
              (in_stack_fffffffffffffe80,
               (vector<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_> *)in_RDI,
               (float)((ulong)in_stack_fffffffffffffe70 >> 0x20),SUB84(in_stack_fffffffffffffe70,0))
    ;
    this_01 = local_18;
    std::vector<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>::size(&local_160);
    Mat::create(this_00,(int)((ulong)pvVar6 >> 0x20),(int)pvVar6,(size_t)this_01,
                (Allocator *)CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48));
    bVar1 = Mat::empty(in_stack_fffffffffffffe40);
    if (bVar1) {
      local_4 = -100;
    }
    else {
      local_170 = 0;
      while( true ) {
        sVar5 = local_170;
        sVar2 = std::vector<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>::size(&local_160);
        if (sVar2 <= sVar5) break;
        pvVar3 = std::vector<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>::operator[]
                           (&local_160,local_170);
        pfVar4 = Mat::row(local_18,(int)local_170);
        *pfVar4 = (float)(pvVar3->classid + 1);
        pfVar4[1] = pvVar3->prob;
        pfVar4[2] = pvVar3->xmin;
        pfVar4[3] = pvVar3->ymin;
        pfVar4[4] = pvVar3->xmax;
        pfVar4[5] = pvVar3->ymax;
        local_170 = local_170 + 1;
      }
      local_4 = 0;
    }
    std::vector<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>::~vector
              ((vector<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_> *)this_01);
    ObjectsManager::~ObjectsManager((ObjectsManager *)this_01);
  }
  return local_4;
}

Assistant:

int Yolov1Detection::forward_inplace(Mat &bottom_top_blob, const Option &opt) const
{
    int size = side * side;
    int map_total = size * (box_num * 5 + classes);
    if (bottom_top_blob.w < map_total)
        return -1;

    if (softmax_enable)
    {
        Mat classes_scores = bottom_top_blob.range(0, size * classes);
        classes_scores.reshape(classes, size);
        softmax->forward_inplace(classes_scores, opt);
    }

    ObjectsManager objects(size * box_num / 20);
    const float *classes_ptr = bottom_top_blob;
    const float *scales_ptr = classes_ptr + size * classes;
    const float *boxes_ptr = scales_ptr + size * box_num;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < size; i++)
    {
        int x_offset = i % side;
        int y_offset = i / side;

        for (int n = 0; n < box_num; n++)
        {

            float w = (sqrt_enable == 0) * boxes_ptr[2] + (sqrt_enable != 0) * boxes_ptr[2] * boxes_ptr[2];
            float h = (sqrt_enable == 0) * boxes_ptr[3] + (sqrt_enable != 0) * boxes_ptr[3] * boxes_ptr[3];
            float xmin = (boxes_ptr[0] + x_offset) / side - w * 0.5f;
            float ymin = (boxes_ptr[1] + y_offset) / side - h * 0.5f;
            float xmax = xmin + w;
            float ymax = ymin + h;
            boxes_ptr += 4;

            float scale = scales_ptr[0];
            scales_ptr++;

            for (int j = 0; j < classes; j++)
            {
                float prob = scale * classes_ptr[j];
                if (prob > confidence_threshold)
                {
                    ObjectBox object = {
                        .xmin = xmin,
                        .ymin = ymin,
                        .xmax = xmax,
                        .ymax = ymax,
                        .prob = prob,
                        .classid = j,
                    };
                    objects.add_new_object_box(object);
                }
            }
        }

        classes_ptr += classes;
    }

    std::vector<ObjectBox> detected_objects;
    objects.do_objects_nms(detected_objects, nms_threshold, confidence_threshold);

    bottom_top_blob.create(6, (int)detected_objects.size(), 4u, opt.blob_allocator);
    if (bottom_top_blob.empty())
        return -100;

    for (size_t i = 0; i < detected_objects.size(); i++)
    {
        const ObjectBox &r = detected_objects[i];
        float *outptr = bottom_top_blob.row(i);

        outptr[0] = r.classid + 1; // 0 reserve for background
        outptr[1] = r.prob;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}